

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O2

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<65UL>,_void>
::to_json(json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<65UL>,_void>
          *this,bitset<65UL> *val,allocator_type *alloc)

{
  byte bVar1;
  byte bVar2;
  undefined8 extraout_RDX;
  size_t i;
  ulong uVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar4;
  uint8_t byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  
  bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  byte = '\0';
  bVar1 = 0x80;
  bVar2 = 0;
  for (uVar3 = 0; uVar3 != 0x41; uVar3 = uVar3 + 1) {
    if (((val->super__Base_bitset<2UL>)._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
      bVar2 = bVar2 | bVar1;
      byte = bVar2;
    }
    if (bVar1 < 2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&bits,&byte);
      byte = '\0';
      bVar1 = 0x80;
      bVar2 = 0;
    }
    else {
      bVar1 = bVar1 >> 1;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&bits,&byte);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  basic_json<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,&bits,8,alloc,0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  bVar4.field_0.int64_.val_ = extraout_RDX;
  bVar4.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar4.field_0;
}

Assistant:

static Json to_json(const std::bitset<N>& val, 
                            const allocator_type& alloc = allocator_type())
        {
            std::vector<uint8_t> bits;

            uint8_t byte = 0;
            uint8_t mask = 0x80;

            for (std::size_t i = 0; i < N; ++i)
            {
                if (val[i])
                {
                    byte |= mask;
                }

                mask = static_cast<uint8_t>(mask >> 1);

                if (mask == 0)
                {
                    bits.push_back(byte);
                    byte = 0;
                    mask = 0x80;
                }
            }

            // Encode remainder
            if (mask != 0x80)
            {
                bits.push_back(byte);
            }

            Json j(byte_string_arg, bits, semantic_tag::base16, alloc);
            return j;
        }